

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall CoreML::Specification::Optimizer::Optimizer(Optimizer *this,Optimizer *from)

{
  ulong uVar1;
  AdamOptimizer *this_00;
  SGDOptimizer *this_01;
  undefined1 *puVar2;
  Arena *pAVar3;
  
  (this->super_MessageLite)._internal_metadata_.ptr_ = 0;
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__Optimizer_004b9e60;
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = 0;
  uVar1 = (from->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               (string *)((uVar1 & 0xfffffffffffffffc) + 8));
  }
  this->_oneof_case_[0] = 0;
  if (from->_oneof_case_[0] == 10) {
    clear_OptimizerType(this);
    this->_oneof_case_[0] = 10;
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    pAVar3 = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      pAVar3 = *(Arena **)pAVar3;
    }
    this_01 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::SGDOptimizer>
                        (pAVar3);
    (this->OptimizerType_).sgdoptimizer_ = this_01;
    if (from->_oneof_case_[0] == 10) {
      puVar2 = (undefined1 *)(from->OptimizerType_).sgdoptimizer_;
    }
    else {
      puVar2 = _SGDOptimizer_default_instance_;
    }
    SGDOptimizer::MergeFrom(this_01,(SGDOptimizer *)puVar2);
  }
  else if (from->_oneof_case_[0] == 0xb) {
    clear_OptimizerType(this);
    this->_oneof_case_[0] = 0xb;
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    pAVar3 = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      pAVar3 = *(Arena **)pAVar3;
    }
    this_00 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::AdamOptimizer>
                        (pAVar3);
    (this->OptimizerType_).adamoptimizer_ = this_00;
    if (from->_oneof_case_[0] == 0xb) {
      puVar2 = (undefined1 *)(from->OptimizerType_).adamoptimizer_;
    }
    else {
      puVar2 = _AdamOptimizer_default_instance_;
    }
    AdamOptimizer::MergeFrom(this_00,(AdamOptimizer *)puVar2);
  }
  return;
}

Assistant:

Optimizer::Optimizer(const Optimizer& from)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite() {
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  clear_has_OptimizerType();
  switch (from.OptimizerType_case()) {
    case kSgdOptimizer: {
      _internal_mutable_sgdoptimizer()->::CoreML::Specification::SGDOptimizer::MergeFrom(from._internal_sgdoptimizer());
      break;
    }
    case kAdamOptimizer: {
      _internal_mutable_adamoptimizer()->::CoreML::Specification::AdamOptimizer::MergeFrom(from._internal_adamoptimizer());
      break;
    }
    case OPTIMIZERTYPE_NOT_SET: {
      break;
    }
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.Optimizer)
}